

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArbitraryInteger.cpp
# Opt level: O2

TCompareResult __thiscall
Refal2::CArbitraryInteger::Compare(CArbitraryInteger *this,CArbitraryInteger *operand)

{
  byte bVar1;
  TCompareResult TVar2;
  
  removeLeadingZeros(this);
  removeLeadingZeros(operand);
  bVar1 = this->isNegative;
  if ((bool)bVar1 == operand->isNegative) {
    TVar2 = compare(this,operand);
    if (TVar2 == CR_Less) {
      TVar2 = (uint)this->isNegative + CR_Less;
      goto LAB_0012132d;
    }
    if (TVar2 == CR_Equal) {
      return CR_Equal;
    }
    bVar1 = this->isNegative;
  }
  TVar2 = -(bVar1 & 1);
LAB_0012132d:
  return TVar2 | CR_Great;
}

Assistant:

CArbitraryInteger::TCompareResult CArbitraryInteger::Compare(
	const CArbitraryInteger& operand ) const
{
	const_cast<CArbitraryInteger&>( *this ).removeLeadingZeros();
	const_cast<CArbitraryInteger&>( operand ).removeLeadingZeros();
	if( IsNegative() == operand.IsNegative() ) {
		switch( compare( operand ) ) {
			case CR_Less:
				return ( IsNegative() ? CR_Great : CR_Less );
			case CR_Equal:
				return CR_Equal;
			case CR_Great:
				break;
			default:
				assert( false );
				break;
		}
	}
	return ( IsNegative() ? CR_Less : CR_Great );
}